

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::sub(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  float fVar2;
  double dVar3;
  Literal local_40;
  double local_28;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x467);
  case i32:
    (__return_storage_ptr__->field_0).i32 = (this->field_0).i32 - (other->field_0).i32;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  case i64:
    (__return_storage_ptr__->field_0).gcData.
    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((long)(this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr - (other->field_0).i64);
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  case f32:
    fVar2 = getf32(this);
    local_28 = (double)CONCAT44(local_28._4_4_,fVar2);
    fVar2 = getf32(other);
    local_40.field_0.i32 = (int32_t)(local_28._0_4_ - fVar2);
    local_40.type.id = 4;
    standardizeNaN(__return_storage_ptr__,&local_40);
    break;
  case f64:
    local_28 = getf64(this);
    dVar3 = getf64(other);
    local_40.field_0.i64 = (int64_t)(local_28 - dVar3);
    local_40.type.id = 5;
    standardizeNaN(__return_storage_ptr__,&local_40);
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x469);
  }
  ~Literal(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::sub(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) - uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) - uint64_t(other.i64));
    case Type::f32:
      return standardizeNaN(Literal(getf32() - other.getf32()));
    case Type::f64:
      return standardizeNaN(Literal(getf64() - other.getf64()));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}